

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_width<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
                 *handler)

{
  int iVar1;
  char *begin_00;
  width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
  local_30;
  char *local_28;
  
  local_28 = begin;
  if (begin != end) {
    if ((byte)(*begin - 0x30U) < 10) {
      iVar1 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                        (&local_28,end,handler);
      ((handler->
       super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
       ).super_specs_setter<char>.specs_)->width = iVar1;
      begin_00 = local_28;
    }
    else {
      begin_00 = begin;
      if (*begin == '{') {
        begin_00 = begin + 1;
        if (begin_00 != end) {
          local_30.handler = handler;
          begin_00 = parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>>
                               (begin_00,end,&local_30);
        }
        if ((begin_00 == end) || (*begin_00 != '}')) {
          dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
          ::on_error(&handler->
                      super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
                     ,"invalid format string");
        }
        else {
          begin_00 = begin_00 + 1;
        }
      }
    }
    return begin_00;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/format.h"
              ,0x9d8,"");
}

Assistant:

FMT_CONSTEXPR const Char* parse_width(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}